

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl.cpp
# Opt level: O1

void ImGui_ImplSDL2_NewFrame(SDL_Window *window)

{
  ImFontAtlas *pIVar1;
  byte bVar2;
  bool bVar3;
  char cVar4;
  short sVar5;
  ImGuiMouseCursor IVar6;
  int iVar7;
  ImGuiIO *pIVar8;
  ulong uVar9;
  Uint64 UVar10;
  SDL_Window *pSVar11;
  long lVar12;
  SDL_Cursor *pSVar13;
  undefined8 uVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int h;
  int w;
  int my;
  int mx;
  int display_h;
  int display_w;
  int wx;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  pIVar8 = ImGui::GetIO();
  pIVar1 = pIVar8->Fonts;
  if ((0 < (pIVar1->Fonts).Size) &&
     ((pIVar1->TexPixelsAlpha8 != (uchar *)0x0 || (pIVar1->TexPixelsRGBA32 != (uint *)0x0)))) {
    SDL_GetWindowSize(window,&local_44,&local_48);
    uVar9 = SDL_GetWindowFlags(window);
    if ((uVar9 & 0x40) != 0) {
      local_48 = 0;
      local_44 = 0;
    }
    SDL_GL_GetDrawableSize(window,&local_34,&local_38);
    (pIVar8->DisplaySize).x = (float)local_44;
    (pIVar8->DisplaySize).y = (float)local_48;
    if (0 < local_48 && 0 < local_44) {
      (pIVar8->DisplayFramebufferScale).x = (float)local_34 / (float)local_44;
      (pIVar8->DisplayFramebufferScale).y = (float)local_38 / (float)local_48;
    }
    if (ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency == '\0') {
      iVar7 = __cxa_guard_acquire(&ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency);
      if (iVar7 != 0) {
        ImGui_ImplSDL2_NewFrame::frequency = SDL_GetPerformanceFrequency();
        __cxa_guard_release(&ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency);
      }
    }
    UVar10 = SDL_GetPerformanceCounter();
    if (g_Time == 0) {
      fVar15 = 0.016666668;
    }
    else {
      lVar12 = UVar10 - g_Time;
      auVar17._8_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar17._0_8_ = lVar12;
      auVar17._12_4_ = 0x45300000;
      auVar18._8_4_ = (int)(ImGui_ImplSDL2_NewFrame::frequency >> 0x20);
      auVar18._0_8_ = ImGui_ImplSDL2_NewFrame::frequency;
      auVar18._12_4_ = 0x45300000;
      fVar15 = (float)(((auVar17._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) /
                      ((auVar18._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)ImGui_ImplSDL2_NewFrame::frequency) -
                      4503599627370496.0)));
    }
    pIVar8->DeltaTime = fVar15;
    g_Time = UVar10;
    pIVar8 = ImGui::GetIO();
    if (pIVar8->WantSetMousePos == true) {
      SDL_WarpMouseInWindow(g_Window,(int)(pIVar8->MousePos).x,(int)(pIVar8->MousePos).y);
    }
    else {
      (pIVar8->MousePos).x = -3.4028235e+38;
      (pIVar8->MousePos).y = -3.4028235e+38;
    }
    bVar2 = SDL_GetMouseState(&local_3c,&local_40);
    pIVar8->MouseDown[0] = (bool)((_ZL14g_MousePressed_0 | bVar2) & 1);
    pIVar8->MouseDown[1] = (bool)((bVar2 >> 2 | _ZL14g_MousePressed_1) & 1);
    pIVar8->MouseDown[2] = (bool)((bVar2 >> 1 | _ZL14g_MousePressed_2) & 1);
    _ZL14g_MousePressed_2 = 0;
    _ZL14g_MousePressed_1 = 0;
    _ZL14g_MousePressed_0 = 0;
    pSVar11 = (SDL_Window *)SDL_GetKeyboardFocus();
    if (g_Window == pSVar11) {
      if (g_MouseCanUseGlobalState == true) {
        SDL_GetWindowPosition(pSVar11,&local_2c,&local_30);
        SDL_GetGlobalMouseState(&local_3c,&local_40);
        local_3c = local_3c - local_2c;
        local_40 = local_40 - local_30;
      }
      (pIVar8->MousePos).x = (float)local_3c;
      (pIVar8->MousePos).y = (float)local_40;
    }
    bVar3 = ImGui::IsAnyMouseDown();
    SDL_CaptureMouse(bVar3);
    pIVar8 = ImGui::GetIO();
    if ((pIVar8->ConfigFlags & 0x20) == 0) {
      IVar6 = ImGui::GetMouseCursor();
      uVar14 = 0;
      if ((IVar6 != -1) && (pIVar8->MouseDrawCursor == false)) {
        pSVar13 = g_MouseCursors[IVar6];
        if (g_MouseCursors[IVar6] == (SDL_Cursor *)0x0) {
          pSVar13 = g_MouseCursors[0];
        }
        SDL_SetCursor(pSVar13);
        uVar14 = 1;
      }
      SDL_ShowCursor(uVar14);
    }
    pIVar8 = ImGui::GetIO();
    pIVar8->NavInputs[0] = 0.0;
    pIVar8->NavInputs[1] = 0.0;
    pIVar8->NavInputs[2] = 0.0;
    pIVar8->NavInputs[3] = 0.0;
    pIVar8->NavInputs[4] = 0.0;
    pIVar8->NavInputs[5] = 0.0;
    pIVar8->NavInputs[6] = 0.0;
    pIVar8->NavInputs[7] = 0.0;
    pIVar8->NavInputs[8] = 0.0;
    pIVar8->NavInputs[9] = 0.0;
    pIVar8->NavInputs[10] = 0.0;
    pIVar8->NavInputs[0xb] = 0.0;
    pIVar8->NavInputs[0xc] = 0.0;
    pIVar8->NavInputs[0xd] = 0.0;
    pIVar8->NavInputs[0xe] = 0.0;
    pIVar8->NavInputs[0xf] = 0.0;
    pIVar8->NavInputs[0x10] = 0.0;
    pIVar8->NavInputs[0x11] = 0.0;
    pIVar8->NavInputs[0x12] = 0.0;
    pIVar8->NavInputs[0x13] = 0.0;
    pIVar8->NavInputs[0x14] = 0.0;
    if ((pIVar8->ConfigFlags & 2) != 0) {
      lVar12 = SDL_GameControllerOpen(0);
      if (lVar12 == 0) {
        *(byte *)&pIVar8->BackendFlags = (byte)pIVar8->BackendFlags & 0xfe;
      }
      else {
        cVar4 = SDL_GameControllerGetButton(lVar12,0);
        fVar15 = 0.0;
        if (cVar4 != '\0') {
          fVar15 = 1.0;
        }
        pIVar8->NavInputs[0] = fVar15;
        cVar4 = SDL_GameControllerGetButton(lVar12,1);
        fVar15 = 0.0;
        if (cVar4 != '\0') {
          fVar15 = 1.0;
        }
        pIVar8->NavInputs[1] = fVar15;
        cVar4 = SDL_GameControllerGetButton(lVar12,2);
        fVar15 = 0.0;
        if (cVar4 != '\0') {
          fVar15 = 1.0;
        }
        pIVar8->NavInputs[3] = fVar15;
        cVar4 = SDL_GameControllerGetButton(lVar12,3);
        fVar15 = 0.0;
        if (cVar4 != '\0') {
          fVar15 = 1.0;
        }
        pIVar8->NavInputs[2] = fVar15;
        cVar4 = SDL_GameControllerGetButton(lVar12,0xd);
        fVar15 = 0.0;
        if (cVar4 != '\0') {
          fVar15 = 1.0;
        }
        pIVar8->NavInputs[4] = fVar15;
        cVar4 = SDL_GameControllerGetButton(lVar12,0xe);
        fVar15 = 0.0;
        if (cVar4 != '\0') {
          fVar15 = 1.0;
        }
        pIVar8->NavInputs[5] = fVar15;
        cVar4 = SDL_GameControllerGetButton(lVar12,0xb);
        fVar15 = 0.0;
        if (cVar4 != '\0') {
          fVar15 = 1.0;
        }
        pIVar8->NavInputs[6] = fVar15;
        cVar4 = SDL_GameControllerGetButton(lVar12,0xc);
        fVar15 = 0.0;
        if (cVar4 != '\0') {
          fVar15 = 1.0;
        }
        pIVar8->NavInputs[7] = fVar15;
        cVar4 = SDL_GameControllerGetButton(lVar12,9);
        fVar15 = 0.0;
        if (cVar4 != '\0') {
          fVar15 = 1.0;
        }
        pIVar8->NavInputs[0xc] = fVar15;
        cVar4 = SDL_GameControllerGetButton(lVar12,10);
        fVar15 = 0.0;
        if (cVar4 != '\0') {
          fVar15 = 1.0;
        }
        pIVar8->NavInputs[0xd] = fVar15;
        cVar4 = SDL_GameControllerGetButton(lVar12,9);
        fVar15 = 0.0;
        if (cVar4 != '\0') {
          fVar15 = 1.0;
        }
        pIVar8->NavInputs[0xe] = fVar15;
        cVar4 = SDL_GameControllerGetButton(lVar12,10);
        fVar15 = 0.0;
        if (cVar4 != '\0') {
          fVar15 = 1.0;
        }
        pIVar8->NavInputs[0xf] = fVar15;
        sVar5 = SDL_GameControllerGetAxis(lVar12,0);
        fVar16 = (float)(sVar5 + 8000) / -24768.0;
        fVar15 = 1.0;
        if (fVar16 <= 1.0) {
          fVar15 = fVar16;
        }
        if ((0.0 < fVar15) && (pIVar8->NavInputs[8] <= fVar15 && fVar15 != pIVar8->NavInputs[8])) {
          pIVar8->NavInputs[8] = fVar15;
        }
        sVar5 = SDL_GameControllerGetAxis(lVar12,0);
        fVar16 = (float)(sVar5 + -8000) / 24767.0;
        fVar15 = 1.0;
        if (fVar16 <= 1.0) {
          fVar15 = fVar16;
        }
        if ((0.0 < fVar15) && (pIVar8->NavInputs[9] <= fVar15 && fVar15 != pIVar8->NavInputs[9])) {
          pIVar8->NavInputs[9] = fVar15;
        }
        sVar5 = SDL_GameControllerGetAxis(lVar12,1);
        fVar16 = (float)(sVar5 + 8000) / -24767.0;
        fVar15 = 1.0;
        if (fVar16 <= 1.0) {
          fVar15 = fVar16;
        }
        if ((0.0 < fVar15) && (pIVar8->NavInputs[10] <= fVar15 && fVar15 != pIVar8->NavInputs[10]))
        {
          pIVar8->NavInputs[10] = fVar15;
        }
        sVar5 = SDL_GameControllerGetAxis(lVar12,1);
        fVar16 = (float)(sVar5 + -8000) / 24767.0;
        fVar15 = 1.0;
        if (fVar16 <= 1.0) {
          fVar15 = fVar16;
        }
        if ((0.0 < fVar15) && (pIVar8->NavInputs[0xb] <= fVar15 && fVar15 != pIVar8->NavInputs[0xb])
           ) {
          pIVar8->NavInputs[0xb] = fVar15;
        }
        *(byte *)&pIVar8->BackendFlags = (byte)pIVar8->BackendFlags | 1;
      }
    }
    return;
  }
  __assert_fail("io.Fonts->IsBuilt() && \"Font atlas not built! It is generally built by the renderer backend. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/backends/imgui_impl_sdl.cpp"
                ,0x15a,"void ImGui_ImplSDL2_NewFrame(SDL_Window *)");
}

Assistant:

void ImGui_ImplSDL2_NewFrame(SDL_Window* window)
{
    ImGuiIO& io = ImGui::GetIO();
    IM_ASSERT(io.Fonts->IsBuilt() && "Font atlas not built! It is generally built by the renderer backend. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().");

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    SDL_GetWindowSize(window, &w, &h);
    if (SDL_GetWindowFlags(window) & SDL_WINDOW_MINIMIZED)
        w = h = 0;
    SDL_GL_GetDrawableSize(window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    if (w > 0 && h > 0)
        io.DisplayFramebufferScale = ImVec2((float)display_w / w, (float)display_h / h);

    // Setup time step (we don't use SDL_GetTicks() because it is using millisecond resolution)
    static Uint64 frequency = SDL_GetPerformanceFrequency();
    Uint64 current_time = SDL_GetPerformanceCounter();
    io.DeltaTime = g_Time > 0 ? (float)((double)(current_time - g_Time) / frequency) : (float)(1.0f / 60.0f);
    g_Time = current_time;

    ImGui_ImplSDL2_UpdateMousePosAndButtons();
    ImGui_ImplSDL2_UpdateMouseCursor();

    // Update game controllers (if enabled and available)
    ImGui_ImplSDL2_UpdateGamepads();
}